

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O2

int __thiscall cmCPackGenerator::PrepareGroupingKind(cmCPackGenerator *this)

{
  cmCPackLog *pcVar1;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  ostream *poVar5;
  ComponentPackageMethod CVar6;
  ComponentPackageMethod CVar7;
  ComponentPackageMethod CVar8;
  char *local_1e8 [4];
  string groupingType;
  ostringstream cmCPackLog_msg;
  
  std::__cxx11::string::string
            ((string *)&cmCPackLog_msg,"CPACK_COMPONENTS_ALL_IN_ONE_PACKAGE",
             (allocator *)&groupingType);
  pcVar3 = GetOption(this,(string *)&cmCPackLog_msg);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  std::__cxx11::string::string
            ((string *)&cmCPackLog_msg,"CPACK_COMPONENTS_IGNORE_GROUPS",(allocator *)&groupingType);
  pcVar4 = GetOption(this,(string *)&cmCPackLog_msg);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  CVar6 = (uint)(pcVar3 == (char *)0x0) * 3;
  if (pcVar4 != (char *)0x0) {
    CVar6 = ONE_PACKAGE_PER_COMPONENT;
  }
  std::__cxx11::string::string
            ((string *)&cmCPackLog_msg,"CPACK_COMPONENTS_ONE_PACKAGE_PER_GROUP",
             (allocator *)&groupingType);
  pcVar3 = GetOption(this,(string *)&cmCPackLog_msg);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  CVar7 = ONE_PACKAGE_PER_GROUP;
  if (pcVar3 == (char *)0x0) {
    CVar7 = CVar6;
  }
  groupingType._M_dataplus._M_p = (pointer)&groupingType.field_2;
  groupingType._M_string_length = 0;
  groupingType.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string
            ((string *)&cmCPackLog_msg,"CPACK_COMPONENTS_GROUPING",(allocator *)local_1e8);
  pcVar3 = GetOption(this,(string *)&cmCPackLog_msg);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  if (pcVar3 != (char *)0x0) {
    std::__cxx11::string::string
              ((string *)&cmCPackLog_msg,"CPACK_COMPONENTS_GROUPING",(allocator *)local_1e8);
    GetOption(this,(string *)&cmCPackLog_msg);
    std::__cxx11::string::assign((char *)&groupingType);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  }
  if (groupingType._M_string_length == 0) {
LAB_002855c2:
    if (CVar7 == UNKNOWN_COMPONENT_PACKAGE_METHOD) goto LAB_002856b4;
    CVar8 = CVar6;
    if (CVar7 == ONE_PACKAGE_PER_GROUP) {
LAB_002855d9:
      if ((this->ComponentGroups)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
        CVar8 = ONE_PACKAGE_PER_GROUP;
        if ((this->Components)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
          CVar6 = this->componentPackageMethod;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
          poVar5 = std::operator<<((ostream *)&cmCPackLog_msg,"[");
          poVar5 = std::operator<<(poVar5,(string *)&this->Name);
          poVar5 = std::operator<<(poVar5,"]");
          poVar5 = std::operator<<(poVar5," One package per component group requested, ");
          poVar5 = std::operator<<(poVar5,"but NO component groups exist: Ignoring component group."
                                  );
          std::endl<char,std::char_traits<char>>(poVar5);
          pcVar1 = this->Logger;
          std::__cxx11::stringbuf::str();
          cmCPackLog::Log(pcVar1,8,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                          ,0x58b,local_1e8[0]);
          CVar8 = (ComponentPackageMethod)(CVar6 != ONE_PACKAGE);
          std::__cxx11::string::~string((string *)local_1e8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
        }
      }
      else {
        CVar8 = ONE_PACKAGE_PER_GROUP;
      }
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
    poVar5 = std::operator<<((ostream *)&cmCPackLog_msg,"[");
    poVar5 = std::operator<<(poVar5,(string *)&this->Name);
    poVar5 = std::operator<<(poVar5,"]");
    poVar5 = std::operator<<(poVar5," requested component grouping = ");
    poVar5 = std::operator<<(poVar5,(string *)&groupingType);
    std::endl<char,std::char_traits<char>>(poVar5);
    pcVar1 = this->Logger;
    std::__cxx11::stringbuf::str();
    cmCPackLog::Log(pcVar1,2,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x563,local_1e8[0]);
    std::__cxx11::string::~string((string *)local_1e8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
    bVar2 = std::operator==(&groupingType,"ALL_COMPONENTS_IN_ONE");
    CVar8 = ONE_PACKAGE;
    if (!bVar2) {
      bVar2 = std::operator==(&groupingType,"IGNORE");
      CVar8 = ONE_PACKAGE_PER_COMPONENT;
      if (!bVar2) {
        bVar2 = std::operator==(&groupingType,"ONE_PER_GROUP");
        if (!bVar2) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
          poVar5 = std::operator<<((ostream *)&cmCPackLog_msg,"[");
          poVar5 = std::operator<<(poVar5,(string *)&this->Name);
          poVar5 = std::operator<<(poVar5,"]");
          poVar5 = std::operator<<(poVar5," requested component grouping type <");
          poVar5 = std::operator<<(poVar5,(string *)&groupingType);
          poVar5 = std::operator<<(poVar5,
                                   "> UNKNOWN not in (ALL_COMPONENTS_IN_ONE,IGNORE,ONE_PER_GROUP)");
          std::endl<char,std::char_traits<char>>(poVar5);
          pcVar1 = this->Logger;
          std::__cxx11::stringbuf::str();
          cmCPackLog::Log(pcVar1,8,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                          ,0x576,local_1e8[0]);
          std::__cxx11::string::~string((string *)local_1e8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
          goto LAB_002855c2;
        }
        goto LAB_002855d9;
      }
    }
  }
  this->componentPackageMethod = CVar8;
LAB_002856b4:
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
  poVar5 = std::operator<<((ostream *)&cmCPackLog_msg,"[");
  poVar5 = std::operator<<(poVar5,(string *)&this->Name);
  poVar5 = std::operator<<(poVar5,"]");
  poVar5 = std::operator<<(poVar5," requested component grouping = ");
  poVar5 = std::operator<<(poVar5,&DAT_004a8cdc +
                                  *(int *)(&DAT_004a8cdc + (ulong)this->componentPackageMethod * 4))
  ;
  std::endl<char,std::char_traits<char>>(poVar5);
  pcVar1 = this->Logger;
  std::__cxx11::stringbuf::str();
  cmCPackLog::Log(pcVar1,2,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                  ,0x59f,local_1e8[0]);
  std::__cxx11::string::~string((string *)local_1e8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
  std::__cxx11::string::~string((string *)&groupingType);
  return 1;
}

Assistant:

int cmCPackGenerator::PrepareGroupingKind()
{
  // find a component package method specified by the user
  ComponentPackageMethod method = UNKNOWN_COMPONENT_PACKAGE_METHOD;

  if(this->GetOption("CPACK_COMPONENTS_ALL_IN_ONE_PACKAGE"))
    {
    method = ONE_PACKAGE;
    }

  if(this->GetOption("CPACK_COMPONENTS_IGNORE_GROUPS"))
    {
    method = ONE_PACKAGE_PER_COMPONENT;
    }

  if(this->GetOption("CPACK_COMPONENTS_ONE_PACKAGE_PER_GROUP"))
    {
    method = ONE_PACKAGE_PER_GROUP;
    }

  std::string groupingType;

  // Second way to specify grouping
  if (NULL != this->GetOption("CPACK_COMPONENTS_GROUPING")) {
     groupingType = this->GetOption("CPACK_COMPONENTS_GROUPING");
  }

  if (!groupingType.empty())
    {
    cmCPackLogger(cmCPackLog::LOG_VERBOSE,  "["
        << this->Name << "]"
        << " requested component grouping = "<< groupingType <<std::endl);
    if (groupingType == "ALL_COMPONENTS_IN_ONE")
      {
      method = ONE_PACKAGE;
      }
    else if (groupingType == "IGNORE")
      {
      method = ONE_PACKAGE_PER_COMPONENT;
      }
    else if (groupingType == "ONE_PER_GROUP")
      {
      method = ONE_PACKAGE_PER_GROUP;
      }
    else
      {
      cmCPackLogger(cmCPackLog::LOG_WARNING, "["
          << this->Name << "]"
          << " requested component grouping type <"<< groupingType
          << "> UNKNOWN not in (ALL_COMPONENTS_IN_ONE,IGNORE,ONE_PER_GROUP)"
          << std::endl);
      }
    }

  // Some components were defined but NO group
  // fallback to default if not group based
  if(method == ONE_PACKAGE_PER_GROUP &&
     this->ComponentGroups.empty() && !this->Components.empty())
    {
    if(componentPackageMethod == ONE_PACKAGE)
      {
      method = ONE_PACKAGE;
      }
    else
      {
      method = ONE_PACKAGE_PER_COMPONENT;
      }
    cmCPackLogger(cmCPackLog::LOG_WARNING, "["
         << this->Name << "]"
         << " One package per component group requested, "
         << "but NO component groups exist: Ignoring component group."
         << std::endl);
    }

  // if user specified packaging method, override the default packaging method
  if(method != UNKNOWN_COMPONENT_PACKAGE_METHOD)
    {
    componentPackageMethod = method;
    }

  const char* method_names[] =
    {
    "ALL_COMPONENTS_IN_ONE",
    "IGNORE_GROUPS",
    "ONE_PER_GROUP"
    };

  cmCPackLogger(cmCPackLog::LOG_VERBOSE,  "["
        << this->Name << "]"
        << " requested component grouping = "
        << method_names[componentPackageMethod]
        << std::endl);

  return 1;
}